

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_snode_merge(lyxp_set *set1,lyxp_set *set2)

{
  lyxp_set_node *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  hash_table *phVar4;
  undefined8 uVar5;
  lyxp_node_type lVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  lyxp_set_type lVar10;
  undefined4 uVar11;
  uint uVar12;
  lyxp_set_node *plVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  
  if ((set1->type & ~LYXP_SET_SNODE_SET) != LYXP_SET_EMPTY) {
LAB_001764f5:
    __assert_fail("((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY)) && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x3e9,"void set_snode_merge(struct lyxp_set *, struct lyxp_set *)");
  }
  if (set2->type != LYXP_SET_EMPTY) {
    if (set2->type != LYXP_SET_SNODE_SET) goto LAB_001764f5;
    if (set1->type == LYXP_SET_EMPTY) {
      lVar10 = set2->type;
      uVar11 = *(undefined4 *)&set2->field_0x4;
      uVar2 = *(undefined8 *)&set2->field_0x8;
      plVar13 = (set2->val).nodes;
      uVar3 = *(undefined8 *)((long)&set2->val + 8);
      uVar8 = set2->used;
      uVar9 = set2->size;
      phVar4 = set2->ht;
      uVar7 = set2->ctx_size;
      uVar5 = *(undefined8 *)&set2->field_0x38;
      set1->ctx_pos = set2->ctx_pos;
      set1->ctx_size = uVar7;
      *(undefined8 *)&set1->field_0x38 = uVar5;
      set1->used = uVar8;
      set1->size = uVar9;
      set1->ht = phVar4;
      (set1->val).nodes = plVar13;
      *(undefined8 *)((long)&set1->val + 8) = uVar3;
      set1->type = lVar10;
      *(undefined4 *)&set1->field_0x4 = uVar11;
      *(undefined8 *)&set1->field_0x8 = uVar2;
    }
    else {
      uVar12 = set1->used;
      uVar14 = set2->used;
      uVar16 = uVar14 + uVar12;
      if (set1->size < uVar16) {
        set1->size = uVar16;
        plVar13 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar16 << 4);
        (set1->val).nodes = plVar13;
        if (plVar13 == (lyxp_set_node *)0x0) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_snode_merge"
                );
          return;
        }
        uVar12 = set1->used;
        uVar14 = set2->used;
      }
      if (uVar14 != 0) {
        uVar15 = 0;
        uVar17 = (ulong)uVar12;
        do {
          uVar18 = 0;
          if (uVar12 == 0) {
LAB_00176454:
            if ((uint)uVar18 == uVar12) goto LAB_00176459;
          }
          else {
            plVar13 = (set1->val).nodes;
            uVar18 = 0;
            do {
              if (plVar13->node == (set2->val).nodes[uVar15].node) goto LAB_00176454;
              uVar18 = uVar18 + 1;
              plVar13 = plVar13 + 1;
            } while (uVar12 != uVar18);
LAB_00176459:
            plVar13 = (set2->val).nodes + uVar15;
            lVar6 = plVar13->type;
            uVar7 = plVar13->pos;
            plVar1 = (set1->val).nodes + uVar17;
            plVar1->node = plVar13->node;
            plVar1->type = lVar6;
            plVar1->pos = uVar7;
            uVar16 = set1->used + 1;
            uVar17 = (ulong)uVar16;
            set1->used = uVar16;
            uVar14 = set2->used;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar14);
      }
      free((set2->val).nodes);
      set2->ctx_pos = 0;
      set2->ctx_size = 0;
      *(undefined8 *)&set2->field_0x38 = 0;
      set2->used = 0;
      set2->size = 0;
      set2->ht = (hash_table *)0x0;
      (set2->val).nodes = (lyxp_set_node *)0x0;
      *(undefined8 *)((long)&set2->val + 8) = 0;
      *(undefined8 *)set2 = 0;
      *(undefined8 *)&set2->field_0x8 = 0;
    }
  }
  return;
}

Assistant:

static void
set_snode_merge(struct lyxp_set *set1, struct lyxp_set *set2)
{
    uint32_t orig_used, i, j;

    assert(((set1->type == LYXP_SET_SNODE_SET) || (set1->type == LYXP_SET_EMPTY))
        && ((set2->type == LYXP_SET_SNODE_SET) || (set2->type == LYXP_SET_EMPTY)));

    if (set2->type == LYXP_SET_EMPTY) {
        return;
    }

    if (set1->type == LYXP_SET_EMPTY) {
        memcpy(set1, set2, sizeof *set1);
        return;
    }

    if (set1->used + set2->used > set1->size) {
        set1->size = set1->used + set2->used;
        set1->val.snodes = ly_realloc(set1->val.snodes, set1->size * sizeof *set1->val.snodes);
        LY_CHECK_ERR_RETURN(!set1->val.snodes, LOGMEM(NULL), );
    }

    orig_used = set1->used;

    for (i = 0; i < set2->used; ++i) {
        for (j = 0; j < orig_used; ++j) {
            /* detect duplicities */
            if (set1->val.snodes[j].snode == set2->val.snodes[i].snode) {
                break;
            }
        }

        if (j == orig_used) {
            memcpy(&set1->val.snodes[set1->used], &set2->val.snodes[i], sizeof *set2->val.snodes);
            ++set1->used;
        }
    }

    free(set2->val.snodes);
    memset(set2, 0, sizeof *set2);
}